

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict sexp_current_directory_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res0;
  sexp_conflict res;
  char *tmp0;
  int len0;
  char buf0 [256];
  char *err;
  sexp_conflict *local_158;
  undefined8 local_150;
  sexp_conflict local_148;
  sexp_conflict local_140;
  char *local_138;
  int local_12c;
  char local_128 [264];
  char *local_20;
  undefined8 local_10;
  long local_8;
  
  local_148 = (sexp_conflict)0x43e;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_158,0,0x10);
  local_158 = &local_148;
  local_150 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_158;
  local_12c = 0x100;
  local_138 = local_128;
  do {
    local_20 = getcwd(local_138,(long)local_12c);
    if (local_20 != (char *)0x0) {
      local_148 = (sexp_conflict)sexp_c_string(local_8,local_138,0xffffffffffffffff);
      local_140 = local_148;
LAB_001058be:
      if (local_12c != 0x100) {
        free(local_138);
      }
      *(undefined8 *)(local_8 + 0x6080) = local_150;
      return local_140;
    }
    if (0xa00000 < local_12c) {
      local_140 = (sexp_conflict)
                  sexp_user_exception(local_8,local_10,
                                      "exceeded max auto-expand len in current-directory",0x23e);
      goto LAB_001058be;
    }
    if (local_12c != 0x100) {
      free(local_138);
    }
    local_12c = local_12c << 1;
    local_138 = (char *)calloc((long)local_12c,1);
  } while( true );
}

Assistant:

sexp sexp_current_directory_stub (sexp ctx, sexp self, sexp_sint_t n) {
  char *err;
  char buf0[256];
  int len0;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  len0 = 256;
  tmp0 = buf0;
 loop:
  err = getcwd(tmp0, len0);
  if (!err) {
  if (len0 > 10485760) {
    res = sexp_user_exception(ctx, self, "exceeded max auto-expand len in current-directory", SEXP_NULL);
} else {
  if (len0 != 256)
    free(tmp0);
  len0 *= 2;
  tmp0 = (char*) calloc(len0, sizeof(tmp0[0]));
  goto loop;
}
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  if (len0 != 256)
    free(tmp0);
  sexp_gc_release1(ctx);
  return res;
}